

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void synthesisU16(OpenJTalk *oj,char16_t *txt)

{
  char *__ptr;
  char *in_RDI;
  char *txt_utf8;
  
  __ptr = u16tou8((char16_t *)0x1975b8);
  synthesis((OpenJTalk *)txt_utf8,in_RDI);
  free(__ptr);
  return;
}

Assistant:

void synthesisU16(OpenJTalk *oj, const char16_t *txt)
{
#if defined(_WIN32)
	if (g_verbose)
	{
		console_message("charset: UTF-16\n");
	}
#endif
	char *txt_utf8 = u16tou8((char16_t *)txt);
	synthesis(oj, txt_utf8);
	free(txt_utf8);
}